

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecfloat.cpp
# Opt level: O0

istream * operator>>(istream *is,vec4f *v)

{
  void *pvVar1;
  istream *piVar2;
  float *in_RSI;
  void *in_RDI;
  
  pvVar1 = (void *)std::istream::operator>>(in_RDI,in_RSI);
  pvVar1 = (void *)std::istream::operator>>(pvVar1,in_RSI + 1);
  pvVar1 = (void *)std::istream::operator>>(pvVar1,in_RSI + 2);
  piVar2 = (istream *)std::istream::operator>>(pvVar1,in_RSI + 3);
  return piVar2;
}

Assistant:

std::istream& operator >> (std::istream& is, vec4f& v) {
	return is >> v.x >> v.y >> v.z >> v.w;
}